

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

bool __thiscall
testing::internal::
CartesianProductGenerator<unsigned_char,_void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>::
IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_>::Equals
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_> *this,
          ParamIteratorInterface<std::tuple<unsigned_char,_void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>_>
          *other)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar4;
  IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_> *this_00;
  GTestLog local_1c;
  
  iVar2 = (*(this->
            super_ParamIteratorInterface<std::tuple<unsigned_char,_void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>_>
            )._vptr_ParamIteratorInterface[2])();
  iVar3 = (*other->_vptr_ParamIteratorInterface[2])(other);
  bVar1 = IsTrue(CONCAT44(extraout_var,iVar2) == CONCAT44(extraout_var_00,iVar3));
  if (!bVar1) {
    GTestLog::GTestLog(&local_1c,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/internal/gtest-param-util.h"
                       ,0x36f);
    poVar4 = std::operator<<((ostream *)&std::cerr,
                             "Condition BaseGenerator() == other.BaseGenerator() failed. ");
    poVar4 = std::operator<<(poVar4,"The program attempted to compare iterators ");
    poVar4 = std::operator<<(poVar4,"from different generators.");
    std::endl<char,std::char_traits<char>>(poVar4);
    GTestLog::~GTestLog(&local_1c);
  }
  this_00 = CheckedDowncastToActualType<testing::internal::CartesianProductGenerator<unsigned_char,void(*)(short_const*,int*,int,txfm_param*)>::IteratorImpl<testing::internal::IndexSequence<0ul,1ul>>const,testing::internal::ParamIteratorInterface<std::tuple<unsigned_char,void(*)(short_const*,int*,int,txfm_param*)>>const>
                      (other);
  bVar1 = AtEnd(this);
  if ((bVar1) && (bVar1 = AtEnd(this_00), bVar1)) {
    return true;
  }
  bVar1 = ParamIterator<unsigned_char>::operator==
                    (&(this->current_).
                      super__Tuple_impl<0UL,_testing::internal::ParamIterator<unsigned_char>,_testing::internal::ParamIterator<void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>_>
                      .super__Head_base<0UL,_testing::internal::ParamIterator<unsigned_char>,_false>
                      ._M_head_impl,
                     &(this_00->current_).
                      super__Tuple_impl<0UL,_testing::internal::ParamIterator<unsigned_char>,_testing::internal::ParamIterator<void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>_>
                      .super__Head_base<0UL,_testing::internal::ParamIterator<unsigned_char>,_false>
                      ._M_head_impl);
  if (bVar1) {
    bVar1 = ParamIterator<void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>::operator==
                      ((ParamIterator<void_(*)(const_short_*,_int_*,_int,_txfm_param_*)> *)
                       &this->current_,
                       (ParamIterator<void_(*)(const_short_*,_int_*,_int,_txfm_param_*)> *)
                       &this_00->current_);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Equals(const ParamIteratorInterface<ParamType>& other) const override {
      // Having the same base generator guarantees that the other
      // iterator is of the same type and we can downcast.
      GTEST_CHECK_(BaseGenerator() == other.BaseGenerator())
          << "The program attempted to compare iterators "
          << "from different generators." << std::endl;
      const IteratorImpl* typed_other =
          CheckedDowncastToActualType<const IteratorImpl>(&other);

      // We must report iterators equal if they both point beyond their
      // respective ranges. That can happen in a variety of fashions,
      // so we have to consult AtEnd().
      if (AtEnd() && typed_other->AtEnd()) return true;

      bool same = true;
      bool dummy[] = {
          (same = same && std::get<I>(current_) ==
                              std::get<I>(typed_other->current_))...};
      (void)dummy;
      return same;
    }